

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * minja::Value::array(vector<minja::Value,_std::allocator<minja::Value>_> *values)

{
  bool bVar1;
  value_type *in_RSI;
  Value *in_RDI;
  Value *item;
  const_iterator __end2;
  const_iterator __begin2;
  vector<minja::Value,_std::allocator<minja::Value>_> *__range2;
  shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>_> array;
  Value *this;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
  local_30 [6];
  
  this = in_RDI;
  std::make_shared<std::vector<minja::Value,std::allocator<minja::Value>>>();
  local_30[0]._M_current =
       (Value *)std::vector<minja::Value,_std::allocator<minja::Value>_>::begin(in_RDI);
  std::vector<minja::Value,_std::allocator<minja::Value>_>::end
            ((vector<minja::Value,_std::allocator<minja::Value>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                        *)this,(__normal_iterator<const_minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                                *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
    ::operator*(local_30);
    std::
    __shared_ptr_access<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a416f);
    std::vector<minja::Value,_std::allocator<minja::Value>_>::push_back
              (in_stack_ffffffffffffffb0,in_RSI);
    __gnu_cxx::
    __normal_iterator<const_minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
    ::operator++(local_30);
  }
  Value(this,(shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>_> *)in_RDI);
  std::shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>_>::~shared_ptr
            ((shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>_> *)0x2a41c0);
  return this;
}

Assistant:

static Value array(const std::vector<Value> values = {}) {
    auto array = std::make_shared<ArrayType>();
    for (const auto& item : values) {
      array->push_back(item);
    }
    return Value(array);
  }